

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AppendLinkedResource
               (cmXMLWriter *xml,string *name,string *path,LinkType linkType)

{
  char *pcVar1;
  string *psVar2;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  int local_34;
  char *pcStack_30;
  int typeTag;
  char *locationTag;
  string *psStack_20;
  LinkType linkType_local;
  string *path_local;
  string *name_local;
  cmXMLWriter *xml_local;
  
  pcStack_30 = "location";
  local_34 = 2;
  if (linkType == VirtualFolder) {
    pcStack_30 = "locationURI";
  }
  if (linkType == LinkToFile) {
    local_34 = 1;
  }
  locationTag._4_4_ = linkType;
  psStack_20 = path;
  path_local = name;
  name_local = (string *)xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"link",&local_59);
  cmXMLWriter::StartElement(xml,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  psVar2 = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"name",&local_91);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)psVar2,&local_90,path_local);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  psVar2 = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"type",&local_b9);
  cmXMLWriter::Element<int>((cmXMLWriter *)psVar2,&local_b8,&local_34);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  psVar2 = name_local;
  pcVar1 = pcStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,pcVar1,&local_e1);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)psVar2,&local_e0,psStack_20);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  cmXMLWriter::EndElement((cmXMLWriter *)name_local);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendLinkedResource(cmXMLWriter& xml,
                                                       const std::string& name,
                                                       const std::string& path,
                                                       LinkType linkType)
{
  const char* locationTag = "location";
  int typeTag = 2;
  if (linkType == VirtualFolder) // ... and not a linked folder
  {
    locationTag = "locationURI";
  }
  if (linkType == LinkToFile) {
    typeTag = 1;
  }

  xml.StartElement("link");
  xml.Element("name", name);
  xml.Element("type", typeTag);
  xml.Element(locationTag, path);
  xml.EndElement();
}